

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqliteBuiltin_db_store(jx9_context *pCtx,int argc,jx9_value **argv)

{
  jx9_user_func *pjVar1;
  jx9_value *pjVar2;
  int iVar3;
  unqlite_col *pCol;
  char *pcVar4;
  int iFlag;
  jx9_vm *pVm;
  jx9_real jVar5;
  ulong uVar6;
  int nByte;
  SyString sName;
  uint local_44;
  SyString local_40;
  
  if (argc < 2) {
    pjVar1 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar4 = "Missing collection name and/or records";
  }
  else {
    pcVar4 = jx9_value_to_string(*argv,(int *)&local_44);
    if (0 < (int)local_44) {
      local_40.nByte = local_44;
      local_40.zString = pcVar4;
      pCol = unqliteCollectionFetch((unqlite_vm *)pCtx->pFunc->pUserData,&local_40,iFlag);
      if (pCol == (unqlite_col *)0x0) {
        jVar5 = 0.0;
        jx9_context_throw_error_format(pCtx,1,"No such collection \'%z\'",&local_40);
      }
      else {
        uVar6 = 1;
        do {
          pjVar2 = argv[uVar6];
          if (((pjVar2->iFlags & 0x40) == 0) ||
             ((((jx9_hashmap *)(pjVar2->x).pOther)->iFlags & 1) != 0)) {
            iVar3 = CollectionStore(pCol,pjVar2);
          }
          else {
            iVar3 = jx9HashmapWalk((jx9_hashmap *)(pjVar2->x).pOther,CollectionRecordArrayWalker,
                                   pCol);
          }
          if (iVar3 != 0) {
            jVar5 = 0.0;
            jx9_context_throw_error_format
                      (pCtx,1,"Error while storing record %d in collection \'%z\'",
                       uVar6 & 0xffffffff,&local_40);
            goto LAB_001186fc;
          }
          uVar6 = uVar6 + 1;
        } while ((uint)argc != uVar6);
        jVar5 = 4.94065645841247e-324;
      }
      goto LAB_001186fc;
    }
    pjVar1 = pCtx->pFunc;
    pVm = pCtx->pVm;
    pcVar4 = "Invalid collection name";
  }
  jx9VmThrowError(pVm,&pjVar1->sName,1,pcVar4);
  jVar5 = 0.0;
LAB_001186fc:
  pjVar2 = pCtx->pRet;
  jx9MemObjRelease(pjVar2);
  (pjVar2->x).rVal = jVar5;
  pjVar2->iFlags = pjVar2->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int unqliteBuiltin_db_store(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	int rc;
	int i;
	/* Extract collection name */
	if( argc < 2 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name and/or records");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol == 0 ){
		jx9_context_throw_error_format(pCtx,JX9_CTX_ERR,"No such collection '%z'",&sName);
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	/* Store the given values */
	for( i = 1 ; i < argc ; ++i ){
		rc = unqliteCollectionPut(pCol,argv[i],0);
		if( rc != UNQLITE_OK){
			jx9_context_throw_error_format(pCtx,JX9_CTX_ERR,
				"Error while storing record %d in collection '%z'",i,&sName
				);
			/* Return false */
			jx9_result_bool(pCtx,0);
			return JX9_OK;
		}
	}
	/* All done, return TRUE */
	jx9_result_bool(pCtx,1);
	return JX9_OK;
}